

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

void __thiscall
libcellml::Parser::ParserImpl::loadUnit(ParserImpl *this,UnitsPtr *units,XmlNodePtr *node)

{
  IssueImpl *pIVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  bool bVar2;
  long *plVar3;
  undefined8 *puVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  size_type *psVar6;
  ulong *puVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  ulong uVar9;
  undefined8 uVar10;
  string *this_02;
  _Alloc_hider _Var11;
  IssuePtr issue_7;
  string textNode;
  XmlAttributePtr attribute;
  IssuePtr issue_2;
  XmlNodePtr childNode;
  double multiplier;
  double exponent;
  string reference;
  string id;
  string prefix;
  string local_218;
  long *local_1f8;
  undefined8 local_1f0;
  long local_1e8;
  undefined8 uStack_1e0;
  ulong *local_1d8;
  long local_1d0;
  ulong local_1c8;
  undefined8 uStack_1c0;
  ulong *local_1b8;
  long local_1b0;
  ulong local_1a8;
  long lStack_1a0;
  string local_198;
  string local_170;
  ulong *local_150;
  long local_148;
  ulong local_140;
  long lStack_138;
  string local_130;
  IssuePtr local_110;
  IssuePtr local_100;
  UnitsPtr *local_f0;
  string local_e8;
  ParserImpl *local_c8;
  XmlNodePtr *local_c0;
  XmlNode local_b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_b0;
  ulong local_a8;
  double local_a0;
  double local_98;
  string local_90;
  string local_70;
  string local_50;
  
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_f0 = units;
  local_c8 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"0","");
  local_98 = 1.0;
  local_a0 = 1.0;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_c0 = node;
  XmlNode::firstChild(&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.mPimpl !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    do {
      bVar2 = XmlNode::isText((XmlNode *)local_b8.mPimpl);
      if (bVar2) {
        XmlNode::convertToString_abi_cxx11_(&local_198,(XmlNode *)local_b8.mPimpl);
        bVar2 = hasNonWhitespaceCharacters(&local_198);
        if (bVar2) {
          Issue::IssueImpl::create();
          pIVar1 = *(IssueImpl **)
                    ((long)local_110.
                           super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                    8);
          XmlNode::attribute_abi_cxx11_
                    (&local_130,
                     (local_c0->super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr,"units");
          plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_130,0,(char *)0x0,0x2b460a);
          local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
          psVar6 = (size_type *)(plVar3 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar3 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar6) {
            local_e8.field_2._M_allocated_capacity = *psVar6;
            local_e8.field_2._8_8_ = plVar3[3];
          }
          else {
            local_e8.field_2._M_allocated_capacity = *psVar6;
            local_e8._M_dataplus._M_p = (pointer)*plVar3;
          }
          local_e8._M_string_length = plVar3[1];
          *plVar3 = (long)psVar6;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          plVar3 = (long *)std::__cxx11::string::append((char *)&local_e8);
          local_150 = &local_140;
          puVar7 = (ulong *)(plVar3 + 2);
          if ((ulong *)*plVar3 == puVar7) {
            local_140 = *puVar7;
            lStack_138 = plVar3[3];
          }
          else {
            local_140 = *puVar7;
            local_150 = (ulong *)*plVar3;
          }
          local_148 = plVar3[1];
          *plVar3 = (long)puVar7;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          NamedEntity::name_abi_cxx11_
                    (&local_170,
                     &((local_f0->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr)->super_NamedEntity);
          uVar9 = 0xf;
          if (local_150 != &local_140) {
            uVar9 = local_140;
          }
          if (uVar9 < local_170._M_string_length + local_148) {
            uVar10 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_170._M_dataplus._M_p != &local_170.field_2) {
              uVar10 = local_170.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar10 < local_170._M_string_length + local_148) goto LAB_0024d96a;
            puVar4 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_170,0,(char *)0x0,(ulong)local_150)
            ;
          }
          else {
LAB_0024d96a:
            puVar4 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_150,(ulong)local_170._M_dataplus._M_p);
          }
          puVar7 = puVar4 + 2;
          if ((ulong *)*puVar4 == puVar7) {
            local_1c8 = *puVar7;
            uStack_1c0 = puVar4[3];
            local_1d8 = &local_1c8;
          }
          else {
            local_1c8 = *puVar7;
            local_1d8 = (ulong *)*puVar4;
          }
          local_1d0 = puVar4[1];
          *puVar4 = puVar7;
          puVar4[1] = 0;
          *(undefined1 *)puVar7 = 0;
          puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_1d8);
          local_1f8 = &local_1e8;
          plVar3 = puVar4 + 2;
          if ((long *)*puVar4 == plVar3) {
            local_1e8 = *plVar3;
            uStack_1e0 = puVar4[3];
          }
          else {
            local_1e8 = *plVar3;
            local_1f8 = (long *)*puVar4;
          }
          local_1f0 = puVar4[1];
          *puVar4 = plVar3;
          puVar4[1] = 0;
          *(undefined1 *)(puVar4 + 2) = 0;
          plVar3 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_1f8,(ulong)local_198._M_dataplus._M_p);
          puVar7 = (ulong *)(plVar3 + 2);
          if ((ulong *)*plVar3 == puVar7) {
            local_1a8 = *puVar7;
            lStack_1a0 = plVar3[3];
            local_1b8 = &local_1a8;
          }
          else {
            local_1a8 = *puVar7;
            local_1b8 = (ulong *)*plVar3;
          }
          local_1b0 = plVar3[1];
          *plVar3 = (long)puVar7;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_1b8);
          local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
          paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(puVar4 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar4 == paVar8) {
            local_218.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
            local_218.field_2._8_8_ = puVar4[3];
          }
          else {
            local_218.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
            local_218._M_dataplus._M_p = (pointer)*puVar4;
          }
          local_218._M_string_length = puVar4[1];
          *puVar4 = paVar8;
          puVar4[1] = 0;
          *(undefined1 *)(puVar4 + 2) = 0;
          Issue::IssueImpl::setDescription(pIVar1,&local_218);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._M_dataplus._M_p != &local_218.field_2) {
            operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
          }
          if (local_1b8 != &local_1a8) {
            operator_delete(local_1b8,local_1a8 + 1);
          }
          if (local_1f8 != &local_1e8) {
            operator_delete(local_1f8,local_1e8 + 1);
          }
          if (local_1d8 != &local_1c8) {
            operator_delete(local_1d8,local_1c8 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_170._M_dataplus._M_p != &local_170.field_2) {
            operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
          }
          if (local_150 != &local_140) {
            operator_delete(local_150,local_140 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != &local_130.field_2) {
            operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
          }
          AnyCellmlElement::AnyCellmlElementImpl::setUnits
                    ((AnyCellmlElementImpl *)
                     **(undefined8 **)
                       (*(size_type *)
                         ((long)local_110.
                                super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr + 8) + 0x28),local_f0);
          Issue::IssueImpl::setReferenceRule
                    (*(IssueImpl **)
                      ((long)local_110.
                             super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                      + 8),XML_UNEXPECTED_CHARACTER);
          Logger::LoggerImpl::addIssue(&local_c8->super_LoggerImpl,&local_110);
          if (local_110.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_110.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != &local_198.field_2) {
          operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        bVar2 = XmlNode::isComment((XmlNode *)local_b8.mPimpl);
        if (!bVar2) {
          Issue::IssueImpl::create();
          pIVar1 = *(IssueImpl **)
                    ((long)local_110.
                           super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                    8);
          XmlNode::attribute_abi_cxx11_
                    (&local_e8,
                     (local_c0->super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr,"units");
          plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_e8,0,(char *)0x0,0x2b460a);
          local_150 = &local_140;
          puVar7 = (ulong *)(plVar3 + 2);
          if ((ulong *)*plVar3 == puVar7) {
            local_140 = *puVar7;
            lStack_138 = plVar3[3];
          }
          else {
            local_140 = *puVar7;
            local_150 = (ulong *)*plVar3;
          }
          local_148 = plVar3[1];
          *plVar3 = (long)puVar7;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_150);
          puVar7 = puVar4 + 2;
          if ((ulong *)*puVar4 == puVar7) {
            local_1c8 = *puVar7;
            uStack_1c0 = puVar4[3];
            local_1d8 = &local_1c8;
          }
          else {
            local_1c8 = *puVar7;
            local_1d8 = (ulong *)*puVar4;
          }
          local_1d0 = puVar4[1];
          *puVar4 = puVar7;
          puVar4[1] = 0;
          *(undefined1 *)(puVar4 + 2) = 0;
          NamedEntity::name_abi_cxx11_
                    (&local_130,
                     &((local_f0->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr)->super_NamedEntity);
          uVar9 = 0xf;
          if (local_1d8 != &local_1c8) {
            uVar9 = local_1c8;
          }
          if (uVar9 < local_130._M_string_length + local_1d0) {
            uVar10 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_130._M_dataplus._M_p != &local_130.field_2) {
              uVar10 = local_130.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar10 < local_130._M_string_length + local_1d0) goto LAB_0024d8b7;
            puVar4 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_130,0,(char *)0x0,(ulong)local_1d8)
            ;
          }
          else {
LAB_0024d8b7:
            puVar4 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_1d8,(ulong)local_130._M_dataplus._M_p);
          }
          local_1f8 = &local_1e8;
          plVar3 = puVar4 + 2;
          if ((long *)*puVar4 == plVar3) {
            local_1e8 = *plVar3;
            uStack_1e0 = puVar4[3];
          }
          else {
            local_1e8 = *plVar3;
            local_1f8 = (long *)*puVar4;
          }
          local_1f0 = puVar4[1];
          *puVar4 = plVar3;
          puVar4[1] = 0;
          *(undefined1 *)plVar3 = 0;
          plVar3 = (long *)std::__cxx11::string::append((char *)&local_1f8);
          puVar7 = (ulong *)(plVar3 + 2);
          if ((ulong *)*plVar3 == puVar7) {
            local_1a8 = *puVar7;
            lStack_1a0 = plVar3[3];
            local_1b8 = &local_1a8;
          }
          else {
            local_1a8 = *puVar7;
            local_1b8 = (ulong *)*plVar3;
          }
          local_1b0 = plVar3[1];
          *plVar3 = (long)puVar7;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          XmlNode::name_abi_cxx11_(&local_170,(XmlNode *)local_b8.mPimpl);
          uVar9 = 0xf;
          if (local_1b8 != &local_1a8) {
            uVar9 = local_1a8;
          }
          if (uVar9 < local_170._M_string_length + local_1b0) {
            uVar10 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_170._M_dataplus._M_p != &local_170.field_2) {
              uVar10 = local_170.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar10 < local_170._M_string_length + local_1b0) goto LAB_0024da98;
            puVar4 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_170,0,(char *)0x0,(ulong)local_1b8)
            ;
          }
          else {
LAB_0024da98:
            puVar4 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_1b8,(ulong)local_170._M_dataplus._M_p);
          }
          local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
          paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(puVar4 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar4 == paVar8) {
            local_218.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
            local_218.field_2._8_8_ = puVar4[3];
          }
          else {
            local_218.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
            local_218._M_dataplus._M_p = (pointer)*puVar4;
          }
          local_218._M_string_length = puVar4[1];
          *puVar4 = paVar8;
          puVar4[1] = 0;
          paVar8->_M_local_buf[0] = '\0';
          puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_218);
          local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
          paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(puVar4 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar4 == paVar8) {
            local_198.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
            local_198.field_2._8_8_ = puVar4[3];
          }
          else {
            local_198.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
            local_198._M_dataplus._M_p = (pointer)*puVar4;
          }
          local_198._M_string_length = puVar4[1];
          *puVar4 = paVar8;
          puVar4[1] = 0;
          *(undefined1 *)(puVar4 + 2) = 0;
          Issue::IssueImpl::setDescription(pIVar1,&local_198);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_dataplus._M_p != &local_198.field_2) {
            operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._M_dataplus._M_p != &local_218.field_2) {
            operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_170._M_dataplus._M_p != &local_170.field_2) {
            operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
          }
          if (local_1b8 != &local_1a8) {
            operator_delete(local_1b8,local_1a8 + 1);
          }
          if (local_1f8 != &local_1e8) {
            operator_delete(local_1f8,local_1e8 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != &local_130.field_2) {
            operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
          }
          if (local_1d8 != &local_1c8) {
            operator_delete(local_1d8,local_1c8 + 1);
          }
          if (local_150 != &local_140) {
            operator_delete(local_150,local_140 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
          }
          AnyCellmlElement::AnyCellmlElementImpl::setUnits
                    ((AnyCellmlElementImpl *)
                     **(undefined8 **)
                       (*(size_type *)
                         ((long)local_110.
                                super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr + 8) + 0x28),local_f0);
          Issue::IssueImpl::setReferenceRule
                    (*(IssueImpl **)
                      ((long)local_110.
                             super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                      + 8),XML_UNEXPECTED_ELEMENT);
          Logger::LoggerImpl::addIssue(&local_c8->super_LoggerImpl,&local_110);
          if (local_110.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_110.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
        }
      }
      XmlNode::next((XmlNode *)&local_198);
      this_01 = p_Stack_b0;
      p_Stack_b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._M_string_length;
      local_b8.mPimpl = (XmlNodeImpl *)local_198._M_dataplus._M_p;
      local_198._M_dataplus._M_p = (pointer)0x0;
      local_198._M_string_length = 0;
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._M_string_length);
      }
    } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_b8.mPimpl !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0);
  }
  XmlNode::firstAttribute((XmlNode *)&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    paVar8 = &local_198.field_2;
    local_a8 = 0;
    do {
      bVar2 = XmlAttribute::isType
                        ((XmlAttribute *)
                         local_110.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr,"units","");
      if (bVar2) {
        if (local_c8->mParsing1XVersion == true) {
          XmlAttribute::value_abi_cxx11_
                    (&local_218,
                     (XmlAttribute *)
                     local_110.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
          convertNonSiUnits(&local_198,&local_218);
          std::__cxx11::string::operator=((string *)&local_90,(string *)&local_198);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_dataplus._M_p != paVar8) {
            operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
          }
          paVar5 = &local_218.field_2;
          uVar10 = local_218.field_2._M_allocated_capacity;
          _Var11._M_p = local_218._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._M_dataplus._M_p != paVar5) {
LAB_0024e1b1:
            operator_delete(_Var11._M_p,uVar10 + 1);
            paVar5 = extraout_RAX;
          }
        }
        else {
          XmlAttribute::value_abi_cxx11_
                    (&local_198,
                     (XmlAttribute *)
                     local_110.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
          paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)std::__cxx11::string::operator=((string *)&local_90,(string *)&local_198);
          uVar10 = local_198.field_2._M_allocated_capacity;
          _Var11._M_p = local_198._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_dataplus._M_p != paVar8) goto LAB_0024e1b1;
        }
        local_a8 = CONCAT71((int7)((ulong)paVar5 >> 8),1);
      }
      else {
        bVar2 = XmlAttribute::isType
                          ((XmlAttribute *)
                           local_110.
                           super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                           "prefix","");
        if (bVar2) {
          XmlAttribute::value_abi_cxx11_
                    (&local_198,
                     (XmlAttribute *)
                     local_110.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
          this_02 = &local_50;
LAB_0024e155:
          std::__cxx11::string::operator=((string *)this_02,(string *)&local_198);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_dataplus._M_p != paVar8) {
            operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          bVar2 = XmlAttribute::isType
                            ((XmlAttribute *)
                             local_110.
                             super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                             ,"exponent","");
          if (bVar2) {
            XmlAttribute::value_abi_cxx11_
                      (&local_198,
                       (XmlAttribute *)
                       local_110.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
            bVar2 = isCellMLReal(&local_198);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_198._M_dataplus._M_p != paVar8) {
              operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1
                             );
            }
            if (bVar2) {
              XmlAttribute::value_abi_cxx11_
                        (&local_198,
                         (XmlAttribute *)
                         local_110.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
              bVar2 = convertToDouble(&local_198,&local_98);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_198._M_dataplus._M_p != paVar8) {
                operator_delete(local_198._M_dataplus._M_p,
                                local_198.field_2._M_allocated_capacity + 1);
              }
              if (bVar2) goto LAB_0024e1c3;
              Issue::IssueImpl::create();
              pIVar1 = (local_100.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->mPimpl;
              XmlNode::attribute_abi_cxx11_
                        (&local_e8,
                         (local_c0->
                         super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                         "units");
              plVar3 = (long *)std::__cxx11::string::replace
                                         ((ulong)&local_e8,0,(char *)0x0,0x2b460a);
              local_150 = &local_140;
              puVar7 = (ulong *)(plVar3 + 2);
              if ((ulong *)*plVar3 == puVar7) {
                local_140 = *puVar7;
                lStack_138 = plVar3[3];
              }
              else {
                local_140 = *puVar7;
                local_150 = (ulong *)*plVar3;
              }
              local_148 = plVar3[1];
              *plVar3 = (long)puVar7;
              plVar3[1] = 0;
              *(undefined1 *)(plVar3 + 2) = 0;
              puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_150);
              local_1d8 = &local_1c8;
              puVar7 = puVar4 + 2;
              if ((ulong *)*puVar4 == puVar7) {
                local_1c8 = *puVar7;
                uStack_1c0 = puVar4[3];
              }
              else {
                local_1c8 = *puVar7;
                local_1d8 = (ulong *)*puVar4;
              }
              local_1d0 = puVar4[1];
              *puVar4 = puVar7;
              puVar4[1] = 0;
              *(undefined1 *)(puVar4 + 2) = 0;
              NamedEntity::name_abi_cxx11_
                        (&local_130,
                         &((local_f0->
                           super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                          ->super_NamedEntity);
              uVar9 = 0xf;
              if (local_1d8 != &local_1c8) {
                uVar9 = local_1c8;
              }
              if (uVar9 < local_130._M_string_length + local_1d0) {
                uVar10 = 0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_130._M_dataplus._M_p != &local_130.field_2) {
                  uVar10 = local_130.field_2._M_allocated_capacity;
                }
                if ((ulong)uVar10 < local_130._M_string_length + local_1d0) goto LAB_0024edbe;
                puVar4 = (undefined8 *)
                         std::__cxx11::string::replace
                                   ((ulong)&local_130,0,(char *)0x0,(ulong)local_1d8);
              }
              else {
LAB_0024edbe:
                puVar4 = (undefined8 *)
                         std::__cxx11::string::_M_append
                                   ((char *)&local_1d8,(ulong)local_130._M_dataplus._M_p);
              }
              local_1f8 = &local_1e8;
              plVar3 = puVar4 + 2;
              if ((long *)*puVar4 == plVar3) {
                local_1e8 = *plVar3;
                uStack_1e0 = puVar4[3];
              }
              else {
                local_1e8 = *plVar3;
                local_1f8 = (long *)*puVar4;
              }
              local_1f0 = puVar4[1];
              *puVar4 = plVar3;
              puVar4[1] = 0;
              *(undefined1 *)plVar3 = 0;
              plVar3 = (long *)std::__cxx11::string::append((char *)&local_1f8);
              local_1b8 = &local_1a8;
              puVar7 = (ulong *)(plVar3 + 2);
              if ((ulong *)*plVar3 == puVar7) {
                local_1a8 = *puVar7;
                lStack_1a0 = plVar3[3];
              }
              else {
                local_1a8 = *puVar7;
                local_1b8 = (ulong *)*plVar3;
              }
              local_1b0 = plVar3[1];
              *plVar3 = (long)puVar7;
              plVar3[1] = 0;
              *(undefined1 *)(plVar3 + 2) = 0;
              XmlAttribute::value_abi_cxx11_
                        (&local_170,
                         (XmlAttribute *)
                         local_110.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
              uVar9 = 0xf;
              if (local_1b8 != &local_1a8) {
                uVar9 = local_1a8;
              }
              if (uVar9 < local_170._M_string_length + local_1b0) {
                uVar10 = 0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_170._M_dataplus._M_p != &local_170.field_2) {
                  uVar10 = local_170.field_2._M_allocated_capacity;
                }
                if ((ulong)uVar10 < local_170._M_string_length + local_1b0) goto LAB_0024f157;
                puVar4 = (undefined8 *)
                         std::__cxx11::string::replace
                                   ((ulong)&local_170,0,(char *)0x0,(ulong)local_1b8);
              }
              else {
LAB_0024f157:
                puVar4 = (undefined8 *)
                         std::__cxx11::string::_M_append
                                   ((char *)&local_1b8,(ulong)local_170._M_dataplus._M_p);
              }
              local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
              paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(puVar4 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar4 == paVar5) {
                local_218.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
                local_218.field_2._8_8_ = puVar4[3];
              }
              else {
                local_218.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
                local_218._M_dataplus._M_p = (pointer)*puVar4;
              }
              local_218._M_string_length = puVar4[1];
              *puVar4 = paVar5;
              puVar4[1] = 0;
              paVar5->_M_local_buf[0] = '\0';
              puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_218);
              paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(puVar4 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar4 == paVar5) {
                local_198.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
                local_198.field_2._8_8_ = puVar4[3];
                local_198._M_dataplus._M_p = (pointer)paVar8;
              }
              else {
                local_198.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
                local_198._M_dataplus._M_p = (pointer)*puVar4;
              }
              local_198._M_string_length = puVar4[1];
              *puVar4 = paVar5;
              puVar4[1] = 0;
              *(undefined1 *)(puVar4 + 2) = 0;
              Issue::IssueImpl::setDescription(pIVar1,&local_198);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_198._M_dataplus._M_p != paVar8) {
                operator_delete(local_198._M_dataplus._M_p,
                                local_198.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_218._M_dataplus._M_p != &local_218.field_2) {
                operator_delete(local_218._M_dataplus._M_p,
                                local_218.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_170._M_dataplus._M_p != &local_170.field_2) {
                operator_delete(local_170._M_dataplus._M_p,
                                local_170.field_2._M_allocated_capacity + 1);
              }
              if (local_1b8 != &local_1a8) {
                operator_delete(local_1b8,local_1a8 + 1);
              }
              if (local_1f8 != &local_1e8) {
                operator_delete(local_1f8,local_1e8 + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_130._M_dataplus._M_p != &local_130.field_2) {
                operator_delete(local_130._M_dataplus._M_p,
                                local_130.field_2._M_allocated_capacity + 1);
              }
              if (local_1d8 != &local_1c8) {
                operator_delete(local_1d8,local_1c8 + 1);
              }
              if (local_150 != &local_140) {
                operator_delete(local_150,local_140 + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1
                               );
              }
              AnyCellmlElement::AnyCellmlElementImpl::setUnits
                        ((((local_100.
                            super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                           ->mPimpl->mItem).
                          super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->mPimpl,local_f0);
              Issue::IssueImpl::setReferenceRule
                        ((local_100.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->mPimpl,UNIT_ATTRIBUTE_EXPONENT_VALUE);
              Logger::LoggerImpl::addIssue(&local_c8->super_LoggerImpl,&local_100);
            }
            else {
              Issue::IssueImpl::create();
              pIVar1 = (local_100.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->mPimpl;
              XmlNode::attribute_abi_cxx11_
                        (&local_e8,
                         (local_c0->
                         super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                         "units");
              plVar3 = (long *)std::__cxx11::string::replace
                                         ((ulong)&local_e8,0,(char *)0x0,0x2b460a);
              local_150 = &local_140;
              puVar7 = (ulong *)(plVar3 + 2);
              if ((ulong *)*plVar3 == puVar7) {
                local_140 = *puVar7;
                lStack_138 = plVar3[3];
              }
              else {
                local_140 = *puVar7;
                local_150 = (ulong *)*plVar3;
              }
              local_148 = plVar3[1];
              *plVar3 = (long)puVar7;
              plVar3[1] = 0;
              *(undefined1 *)(plVar3 + 2) = 0;
              puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_150);
              local_1d8 = &local_1c8;
              puVar7 = puVar4 + 2;
              if ((ulong *)*puVar4 == puVar7) {
                local_1c8 = *puVar7;
                uStack_1c0 = puVar4[3];
              }
              else {
                local_1c8 = *puVar7;
                local_1d8 = (ulong *)*puVar4;
              }
              local_1d0 = puVar4[1];
              *puVar4 = puVar7;
              puVar4[1] = 0;
              *(undefined1 *)(puVar4 + 2) = 0;
              NamedEntity::name_abi_cxx11_
                        (&local_130,
                         &((local_f0->
                           super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                          ->super_NamedEntity);
              uVar9 = 0xf;
              if (local_1d8 != &local_1c8) {
                uVar9 = local_1c8;
              }
              if (uVar9 < local_130._M_string_length + local_1d0) {
                uVar10 = 0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_130._M_dataplus._M_p != &local_130.field_2) {
                  uVar10 = local_130.field_2._M_allocated_capacity;
                }
                if ((ulong)uVar10 < local_130._M_string_length + local_1d0) goto LAB_0024e755;
                puVar4 = (undefined8 *)
                         std::__cxx11::string::replace
                                   ((ulong)&local_130,0,(char *)0x0,(ulong)local_1d8);
              }
              else {
LAB_0024e755:
                puVar4 = (undefined8 *)
                         std::__cxx11::string::_M_append
                                   ((char *)&local_1d8,(ulong)local_130._M_dataplus._M_p);
              }
              local_1f8 = &local_1e8;
              plVar3 = puVar4 + 2;
              if ((long *)*puVar4 == plVar3) {
                local_1e8 = *plVar3;
                uStack_1e0 = puVar4[3];
              }
              else {
                local_1e8 = *plVar3;
                local_1f8 = (long *)*puVar4;
              }
              local_1f0 = puVar4[1];
              *puVar4 = plVar3;
              puVar4[1] = 0;
              *(undefined1 *)plVar3 = 0;
              plVar3 = (long *)std::__cxx11::string::append((char *)&local_1f8);
              local_1b8 = &local_1a8;
              puVar7 = (ulong *)(plVar3 + 2);
              if ((ulong *)*plVar3 == puVar7) {
                local_1a8 = *puVar7;
                lStack_1a0 = plVar3[3];
              }
              else {
                local_1a8 = *puVar7;
                local_1b8 = (ulong *)*plVar3;
              }
              local_1b0 = plVar3[1];
              *plVar3 = (long)puVar7;
              plVar3[1] = 0;
              *(undefined1 *)(plVar3 + 2) = 0;
              XmlAttribute::value_abi_cxx11_
                        (&local_170,
                         (XmlAttribute *)
                         local_110.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
              uVar9 = 0xf;
              if (local_1b8 != &local_1a8) {
                uVar9 = local_1a8;
              }
              if (uVar9 < local_170._M_string_length + local_1b0) {
                uVar10 = 0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_170._M_dataplus._M_p != &local_170.field_2) {
                  uVar10 = local_170.field_2._M_allocated_capacity;
                }
                if ((ulong)uVar10 < local_170._M_string_length + local_1b0) goto LAB_0024e881;
                puVar4 = (undefined8 *)
                         std::__cxx11::string::replace
                                   ((ulong)&local_170,0,(char *)0x0,(ulong)local_1b8);
              }
              else {
LAB_0024e881:
                puVar4 = (undefined8 *)
                         std::__cxx11::string::_M_append
                                   ((char *)&local_1b8,(ulong)local_170._M_dataplus._M_p);
              }
              local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
              paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(puVar4 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar4 == paVar5) {
                local_218.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
                local_218.field_2._8_8_ = puVar4[3];
              }
              else {
                local_218.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
                local_218._M_dataplus._M_p = (pointer)*puVar4;
              }
              local_218._M_string_length = puVar4[1];
              *puVar4 = paVar5;
              puVar4[1] = 0;
              paVar5->_M_local_buf[0] = '\0';
              puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_218);
              paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(puVar4 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar4 == paVar5) {
                local_198.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
                local_198.field_2._8_8_ = puVar4[3];
                local_198._M_dataplus._M_p = (pointer)paVar8;
              }
              else {
                local_198.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
                local_198._M_dataplus._M_p = (pointer)*puVar4;
              }
              local_198._M_string_length = puVar4[1];
              *puVar4 = paVar5;
              puVar4[1] = 0;
              *(undefined1 *)(puVar4 + 2) = 0;
              Issue::IssueImpl::setDescription(pIVar1,&local_198);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_198._M_dataplus._M_p != paVar8) {
                operator_delete(local_198._M_dataplus._M_p,
                                local_198.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_218._M_dataplus._M_p != &local_218.field_2) {
                operator_delete(local_218._M_dataplus._M_p,
                                local_218.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_170._M_dataplus._M_p != &local_170.field_2) {
                operator_delete(local_170._M_dataplus._M_p,
                                local_170.field_2._M_allocated_capacity + 1);
              }
              if (local_1b8 != &local_1a8) {
                operator_delete(local_1b8,local_1a8 + 1);
              }
              if (local_1f8 != &local_1e8) {
                operator_delete(local_1f8,local_1e8 + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_130._M_dataplus._M_p != &local_130.field_2) {
                operator_delete(local_130._M_dataplus._M_p,
                                local_130.field_2._M_allocated_capacity + 1);
              }
              if (local_1d8 != &local_1c8) {
                operator_delete(local_1d8,local_1c8 + 1);
              }
              if (local_150 != &local_140) {
                operator_delete(local_150,local_140 + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1
                               );
              }
              AnyCellmlElement::AnyCellmlElementImpl::setUnits
                        ((((local_100.
                            super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                           ->mPimpl->mItem).
                          super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->mPimpl,local_f0);
              Issue::IssueImpl::setReferenceRule
                        ((local_100.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->mPimpl,UNIT_ATTRIBUTE_EXPONENT_VALUE);
              Logger::LoggerImpl::addIssue(&local_c8->super_LoggerImpl,&local_100);
            }
          }
          else {
            bVar2 = XmlAttribute::isType
                              ((XmlAttribute *)
                               local_110.
                               super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr,"multiplier","");
            if (bVar2) {
              XmlAttribute::value_abi_cxx11_
                        (&local_198,
                         (XmlAttribute *)
                         local_110.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
              bVar2 = isCellMLReal(&local_198);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_198._M_dataplus._M_p != paVar8) {
                operator_delete(local_198._M_dataplus._M_p,
                                local_198.field_2._M_allocated_capacity + 1);
              }
              if (bVar2) {
                XmlAttribute::value_abi_cxx11_
                          (&local_198,
                           (XmlAttribute *)
                           local_110.
                           super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
                bVar2 = convertToDouble(&local_198,&local_a0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_198._M_dataplus._M_p != paVar8) {
                  operator_delete(local_198._M_dataplus._M_p,
                                  local_198.field_2._M_allocated_capacity + 1);
                }
                if (bVar2) goto LAB_0024e1c3;
                Issue::IssueImpl::create();
                pIVar1 = (local_100.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->mPimpl;
                XmlNode::attribute_abi_cxx11_
                          (&local_e8,
                           (local_c0->
                           super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr,"units");
                plVar3 = (long *)std::__cxx11::string::replace
                                           ((ulong)&local_e8,0,(char *)0x0,0x2b460a);
                local_150 = &local_140;
                puVar7 = (ulong *)(plVar3 + 2);
                if ((ulong *)*plVar3 == puVar7) {
                  local_140 = *puVar7;
                  lStack_138 = plVar3[3];
                }
                else {
                  local_140 = *puVar7;
                  local_150 = (ulong *)*plVar3;
                }
                local_148 = plVar3[1];
                *plVar3 = (long)puVar7;
                plVar3[1] = 0;
                *(undefined1 *)(plVar3 + 2) = 0;
                puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_150);
                local_1d8 = &local_1c8;
                puVar7 = puVar4 + 2;
                if ((ulong *)*puVar4 == puVar7) {
                  local_1c8 = *puVar7;
                  uStack_1c0 = puVar4[3];
                }
                else {
                  local_1c8 = *puVar7;
                  local_1d8 = (ulong *)*puVar4;
                }
                local_1d0 = puVar4[1];
                *puVar4 = puVar7;
                puVar4[1] = 0;
                *(undefined1 *)(puVar4 + 2) = 0;
                NamedEntity::name_abi_cxx11_
                          (&local_130,
                           &((local_f0->
                             super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr)->super_NamedEntity);
                uVar9 = 0xf;
                if (local_1d8 != &local_1c8) {
                  uVar9 = local_1c8;
                }
                if (uVar9 < local_130._M_string_length + local_1d0) {
                  uVar10 = 0xf;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_130._M_dataplus._M_p != &local_130.field_2) {
                    uVar10 = local_130.field_2._M_allocated_capacity;
                  }
                  if ((ulong)uVar10 < local_130._M_string_length + local_1d0) goto LAB_0024f8e1;
                  puVar4 = (undefined8 *)
                           std::__cxx11::string::replace
                                     ((ulong)&local_130,0,(char *)0x0,(ulong)local_1d8);
                }
                else {
LAB_0024f8e1:
                  puVar4 = (undefined8 *)
                           std::__cxx11::string::_M_append
                                     ((char *)&local_1d8,(ulong)local_130._M_dataplus._M_p);
                }
                local_1f8 = &local_1e8;
                plVar3 = puVar4 + 2;
                if ((long *)*puVar4 == plVar3) {
                  local_1e8 = *plVar3;
                  uStack_1e0 = puVar4[3];
                }
                else {
                  local_1e8 = *plVar3;
                  local_1f8 = (long *)*puVar4;
                }
                local_1f0 = puVar4[1];
                *puVar4 = plVar3;
                puVar4[1] = 0;
                *(undefined1 *)plVar3 = 0;
                plVar3 = (long *)std::__cxx11::string::append((char *)&local_1f8);
                local_1b8 = &local_1a8;
                puVar7 = (ulong *)(plVar3 + 2);
                if ((ulong *)*plVar3 == puVar7) {
                  local_1a8 = *puVar7;
                  lStack_1a0 = plVar3[3];
                }
                else {
                  local_1a8 = *puVar7;
                  local_1b8 = (ulong *)*plVar3;
                }
                local_1b0 = plVar3[1];
                *plVar3 = (long)puVar7;
                plVar3[1] = 0;
                *(undefined1 *)(plVar3 + 2) = 0;
                XmlAttribute::value_abi_cxx11_
                          (&local_170,
                           (XmlAttribute *)
                           local_110.
                           super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
                uVar9 = 0xf;
                if (local_1b8 != &local_1a8) {
                  uVar9 = local_1a8;
                }
                if (uVar9 < local_170._M_string_length + local_1b0) {
                  uVar10 = 0xf;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_170._M_dataplus._M_p != &local_170.field_2) {
                    uVar10 = local_170.field_2._M_allocated_capacity;
                  }
                  if ((ulong)uVar10 < local_170._M_string_length + local_1b0) goto LAB_0024fa0d;
                  puVar4 = (undefined8 *)
                           std::__cxx11::string::replace
                                     ((ulong)&local_170,0,(char *)0x0,(ulong)local_1b8);
                }
                else {
LAB_0024fa0d:
                  puVar4 = (undefined8 *)
                           std::__cxx11::string::_M_append
                                     ((char *)&local_1b8,(ulong)local_170._M_dataplus._M_p);
                }
                local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
                paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)(puVar4 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar4 == paVar5) {
                  local_218.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
                  local_218.field_2._8_8_ = puVar4[3];
                }
                else {
                  local_218.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
                  local_218._M_dataplus._M_p = (pointer)*puVar4;
                }
                local_218._M_string_length = puVar4[1];
                *puVar4 = paVar5;
                puVar4[1] = 0;
                paVar5->_M_local_buf[0] = '\0';
                puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_218);
                paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)(puVar4 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar4 == paVar5) {
                  local_198.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
                  local_198.field_2._8_8_ = puVar4[3];
                  local_198._M_dataplus._M_p = (pointer)paVar8;
                }
                else {
                  local_198.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
                  local_198._M_dataplus._M_p = (pointer)*puVar4;
                }
                local_198._M_string_length = puVar4[1];
                *puVar4 = paVar5;
                puVar4[1] = 0;
                *(undefined1 *)(puVar4 + 2) = 0;
                Issue::IssueImpl::setDescription(pIVar1,&local_198);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_198._M_dataplus._M_p != paVar8) {
                  operator_delete(local_198._M_dataplus._M_p,
                                  local_198.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_218._M_dataplus._M_p != &local_218.field_2) {
                  operator_delete(local_218._M_dataplus._M_p,
                                  local_218.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_170._M_dataplus._M_p != &local_170.field_2) {
                  operator_delete(local_170._M_dataplus._M_p,
                                  local_170.field_2._M_allocated_capacity + 1);
                }
                if (local_1b8 != &local_1a8) {
                  operator_delete(local_1b8,local_1a8 + 1);
                }
                if (local_1f8 != &local_1e8) {
                  operator_delete(local_1f8,local_1e8 + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_130._M_dataplus._M_p != &local_130.field_2) {
                  operator_delete(local_130._M_dataplus._M_p,
                                  local_130.field_2._M_allocated_capacity + 1);
                }
                if (local_1d8 != &local_1c8) {
                  operator_delete(local_1d8,local_1c8 + 1);
                }
                if (local_150 != &local_140) {
                  operator_delete(local_150,local_140 + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                  operator_delete(local_e8._M_dataplus._M_p,
                                  local_e8.field_2._M_allocated_capacity + 1);
                }
                AnyCellmlElement::AnyCellmlElementImpl::setUnits
                          ((((local_100.
                              super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->mPimpl->mItem).
                            super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->mPimpl,local_f0);
                Issue::IssueImpl::setReferenceRule
                          ((local_100.
                            super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                           ->mPimpl,UNIT_ATTRIBUTE_MULTIPLIER_VALUE);
                Logger::LoggerImpl::addIssue(&local_c8->super_LoggerImpl,&local_100);
              }
              else {
                Issue::IssueImpl::create();
                pIVar1 = (local_100.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->mPimpl;
                XmlNode::attribute_abi_cxx11_
                          (&local_e8,
                           (local_c0->
                           super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr,"units");
                plVar3 = (long *)std::__cxx11::string::replace
                                           ((ulong)&local_e8,0,(char *)0x0,0x2b460a);
                local_150 = &local_140;
                puVar7 = (ulong *)(plVar3 + 2);
                if ((ulong *)*plVar3 == puVar7) {
                  local_140 = *puVar7;
                  lStack_138 = plVar3[3];
                }
                else {
                  local_140 = *puVar7;
                  local_150 = (ulong *)*plVar3;
                }
                local_148 = plVar3[1];
                *plVar3 = (long)puVar7;
                plVar3[1] = 0;
                *(undefined1 *)(plVar3 + 2) = 0;
                puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_150);
                local_1d8 = &local_1c8;
                puVar7 = puVar4 + 2;
                if ((ulong *)*puVar4 == puVar7) {
                  local_1c8 = *puVar7;
                  uStack_1c0 = puVar4[3];
                }
                else {
                  local_1c8 = *puVar7;
                  local_1d8 = (ulong *)*puVar4;
                }
                local_1d0 = puVar4[1];
                *puVar4 = puVar7;
                puVar4[1] = 0;
                *(undefined1 *)(puVar4 + 2) = 0;
                NamedEntity::name_abi_cxx11_
                          (&local_130,
                           &((local_f0->
                             super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr)->super_NamedEntity);
                uVar9 = 0xf;
                if (local_1d8 != &local_1c8) {
                  uVar9 = local_1c8;
                }
                if (uVar9 < local_130._M_string_length + local_1d0) {
                  uVar10 = 0xf;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_130._M_dataplus._M_p != &local_130.field_2) {
                    uVar10 = local_130.field_2._M_allocated_capacity;
                  }
                  if ((ulong)uVar10 < local_130._M_string_length + local_1d0) goto LAB_0024ed1a;
                  puVar4 = (undefined8 *)
                           std::__cxx11::string::replace
                                     ((ulong)&local_130,0,(char *)0x0,(ulong)local_1d8);
                }
                else {
LAB_0024ed1a:
                  puVar4 = (undefined8 *)
                           std::__cxx11::string::_M_append
                                     ((char *)&local_1d8,(ulong)local_130._M_dataplus._M_p);
                }
                local_1f8 = &local_1e8;
                plVar3 = puVar4 + 2;
                if ((long *)*puVar4 == plVar3) {
                  local_1e8 = *plVar3;
                  uStack_1e0 = puVar4[3];
                }
                else {
                  local_1e8 = *plVar3;
                  local_1f8 = (long *)*puVar4;
                }
                local_1f0 = puVar4[1];
                *puVar4 = plVar3;
                puVar4[1] = 0;
                *(undefined1 *)plVar3 = 0;
                plVar3 = (long *)std::__cxx11::string::append((char *)&local_1f8);
                local_1b8 = &local_1a8;
                puVar7 = (ulong *)(plVar3 + 2);
                if ((ulong *)*plVar3 == puVar7) {
                  local_1a8 = *puVar7;
                  lStack_1a0 = plVar3[3];
                }
                else {
                  local_1a8 = *puVar7;
                  local_1b8 = (ulong *)*plVar3;
                }
                local_1b0 = plVar3[1];
                *plVar3 = (long)puVar7;
                plVar3[1] = 0;
                *(undefined1 *)(plVar3 + 2) = 0;
                XmlAttribute::value_abi_cxx11_
                          (&local_170,
                           (XmlAttribute *)
                           local_110.
                           super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
                uVar9 = 0xf;
                if (local_1b8 != &local_1a8) {
                  uVar9 = local_1a8;
                }
                if (uVar9 < local_170._M_string_length + local_1b0) {
                  uVar10 = 0xf;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_170._M_dataplus._M_p != &local_170.field_2) {
                    uVar10 = local_170.field_2._M_allocated_capacity;
                  }
                  if ((ulong)uVar10 < local_170._M_string_length + local_1b0) goto LAB_0024f024;
                  puVar4 = (undefined8 *)
                           std::__cxx11::string::replace
                                     ((ulong)&local_170,0,(char *)0x0,(ulong)local_1b8);
                }
                else {
LAB_0024f024:
                  puVar4 = (undefined8 *)
                           std::__cxx11::string::_M_append
                                     ((char *)&local_1b8,(ulong)local_170._M_dataplus._M_p);
                }
                local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
                paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)(puVar4 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar4 == paVar5) {
                  local_218.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
                  local_218.field_2._8_8_ = puVar4[3];
                }
                else {
                  local_218.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
                  local_218._M_dataplus._M_p = (pointer)*puVar4;
                }
                local_218._M_string_length = puVar4[1];
                *puVar4 = paVar5;
                puVar4[1] = 0;
                paVar5->_M_local_buf[0] = '\0';
                puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_218);
                paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)(puVar4 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar4 == paVar5) {
                  local_198.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
                  local_198.field_2._8_8_ = puVar4[3];
                  local_198._M_dataplus._M_p = (pointer)paVar8;
                }
                else {
                  local_198.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
                  local_198._M_dataplus._M_p = (pointer)*puVar4;
                }
                local_198._M_string_length = puVar4[1];
                *puVar4 = paVar5;
                puVar4[1] = 0;
                *(undefined1 *)(puVar4 + 2) = 0;
                Issue::IssueImpl::setDescription(pIVar1,&local_198);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_198._M_dataplus._M_p != paVar8) {
                  operator_delete(local_198._M_dataplus._M_p,
                                  local_198.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_218._M_dataplus._M_p != &local_218.field_2) {
                  operator_delete(local_218._M_dataplus._M_p,
                                  local_218.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_170._M_dataplus._M_p != &local_170.field_2) {
                  operator_delete(local_170._M_dataplus._M_p,
                                  local_170.field_2._M_allocated_capacity + 1);
                }
                if (local_1b8 != &local_1a8) {
                  operator_delete(local_1b8,local_1a8 + 1);
                }
                if (local_1f8 != &local_1e8) {
                  operator_delete(local_1f8,local_1e8 + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_130._M_dataplus._M_p != &local_130.field_2) {
                  operator_delete(local_130._M_dataplus._M_p,
                                  local_130.field_2._M_allocated_capacity + 1);
                }
                if (local_1d8 != &local_1c8) {
                  operator_delete(local_1d8,local_1c8 + 1);
                }
                if (local_150 != &local_140) {
                  operator_delete(local_150,local_140 + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                  operator_delete(local_e8._M_dataplus._M_p,
                                  local_e8.field_2._M_allocated_capacity + 1);
                }
                AnyCellmlElement::AnyCellmlElementImpl::setUnits
                          ((((local_100.
                              super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->mPimpl->mItem).
                            super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->mPimpl,local_f0);
                Issue::IssueImpl::setReferenceRule
                          ((local_100.
                            super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                           ->mPimpl,UNIT_ATTRIBUTE_MULTIPLIER_VALUE);
                Logger::LoggerImpl::addIssue(&local_c8->super_LoggerImpl,&local_100);
              }
            }
            else {
              bVar2 = isIdAttribute((XmlAttributePtr *)&local_110,local_c8->mParsing1XVersion);
              if (bVar2) {
                XmlAttribute::value_abi_cxx11_
                          (&local_198,
                           (XmlAttribute *)
                           local_110.
                           super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
                this_02 = &local_70;
                goto LAB_0024e155;
              }
              Issue::IssueImpl::create();
              pIVar1 = (local_100.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->mPimpl;
              XmlNode::attribute_abi_cxx11_
                        (&local_e8,
                         (local_c0->
                         super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                         "units");
              plVar3 = (long *)std::__cxx11::string::replace
                                         ((ulong)&local_e8,0,(char *)0x0,0x2b460a);
              local_150 = &local_140;
              puVar7 = (ulong *)(plVar3 + 2);
              if ((ulong *)*plVar3 == puVar7) {
                local_140 = *puVar7;
                lStack_138 = plVar3[3];
              }
              else {
                local_140 = *puVar7;
                local_150 = (ulong *)*plVar3;
              }
              local_148 = plVar3[1];
              *plVar3 = (long)puVar7;
              plVar3[1] = 0;
              *(undefined1 *)(plVar3 + 2) = 0;
              puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_150);
              local_1d8 = &local_1c8;
              puVar7 = puVar4 + 2;
              if ((ulong *)*puVar4 == puVar7) {
                local_1c8 = *puVar7;
                uStack_1c0 = puVar4[3];
              }
              else {
                local_1c8 = *puVar7;
                local_1d8 = (ulong *)*puVar4;
              }
              local_1d0 = puVar4[1];
              *puVar4 = puVar7;
              puVar4[1] = 0;
              *(undefined1 *)(puVar4 + 2) = 0;
              NamedEntity::name_abi_cxx11_
                        (&local_130,
                         &((local_f0->
                           super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                          ->super_NamedEntity);
              uVar9 = 0xf;
              if (local_1d8 != &local_1c8) {
                uVar9 = local_1c8;
              }
              if (uVar9 < local_130._M_string_length + local_1d0) {
                uVar10 = 0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_130._M_dataplus._M_p != &local_130.field_2) {
                  uVar10 = local_130.field_2._M_allocated_capacity;
                }
                if ((ulong)uVar10 < local_130._M_string_length + local_1d0) goto LAB_0024ec12;
                puVar4 = (undefined8 *)
                         std::__cxx11::string::replace
                                   ((ulong)&local_130,0,(char *)0x0,(ulong)local_1d8);
              }
              else {
LAB_0024ec12:
                puVar4 = (undefined8 *)
                         std::__cxx11::string::_M_append
                                   ((char *)&local_1d8,(ulong)local_130._M_dataplus._M_p);
              }
              local_1f8 = &local_1e8;
              plVar3 = puVar4 + 2;
              if ((long *)*puVar4 == plVar3) {
                local_1e8 = *plVar3;
                uStack_1e0 = puVar4[3];
              }
              else {
                local_1e8 = *plVar3;
                local_1f8 = (long *)*puVar4;
              }
              local_1f0 = puVar4[1];
              *puVar4 = plVar3;
              puVar4[1] = 0;
              *(undefined1 *)plVar3 = 0;
              plVar3 = (long *)std::__cxx11::string::append((char *)&local_1f8);
              local_1b8 = &local_1a8;
              puVar7 = (ulong *)(plVar3 + 2);
              if ((ulong *)*plVar3 == puVar7) {
                local_1a8 = *puVar7;
                lStack_1a0 = plVar3[3];
              }
              else {
                local_1a8 = *puVar7;
                local_1b8 = (ulong *)*plVar3;
              }
              local_1b0 = plVar3[1];
              *plVar3 = (long)puVar7;
              plVar3[1] = 0;
              *(undefined1 *)(plVar3 + 2) = 0;
              XmlAttribute::name_abi_cxx11_
                        (&local_170,
                         (XmlAttribute *)
                         local_110.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
              uVar9 = 0xf;
              if (local_1b8 != &local_1a8) {
                uVar9 = local_1a8;
              }
              if (uVar9 < local_170._M_string_length + local_1b0) {
                uVar10 = 0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_170._M_dataplus._M_p != &local_170.field_2) {
                  uVar10 = local_170.field_2._M_allocated_capacity;
                }
                if ((ulong)uVar10 < local_170._M_string_length + local_1b0) goto LAB_0024eef1;
                puVar4 = (undefined8 *)
                         std::__cxx11::string::replace
                                   ((ulong)&local_170,0,(char *)0x0,(ulong)local_1b8);
              }
              else {
LAB_0024eef1:
                puVar4 = (undefined8 *)
                         std::__cxx11::string::_M_append
                                   ((char *)&local_1b8,(ulong)local_170._M_dataplus._M_p);
              }
              local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
              paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(puVar4 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar4 == paVar5) {
                local_218.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
                local_218.field_2._8_8_ = puVar4[3];
              }
              else {
                local_218.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
                local_218._M_dataplus._M_p = (pointer)*puVar4;
              }
              local_218._M_string_length = puVar4[1];
              *puVar4 = paVar5;
              puVar4[1] = 0;
              paVar5->_M_local_buf[0] = '\0';
              puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_218);
              paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(puVar4 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar4 == paVar5) {
                local_198.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
                local_198.field_2._8_8_ = puVar4[3];
                local_198._M_dataplus._M_p = (pointer)paVar8;
              }
              else {
                local_198.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
                local_198._M_dataplus._M_p = (pointer)*puVar4;
              }
              local_198._M_string_length = puVar4[1];
              *puVar4 = paVar5;
              puVar4[1] = 0;
              *(undefined1 *)(puVar4 + 2) = 0;
              Issue::IssueImpl::setDescription(pIVar1,&local_198);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_198._M_dataplus._M_p != paVar8) {
                operator_delete(local_198._M_dataplus._M_p,
                                local_198.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_218._M_dataplus._M_p != &local_218.field_2) {
                operator_delete(local_218._M_dataplus._M_p,
                                local_218.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_170._M_dataplus._M_p != &local_170.field_2) {
                operator_delete(local_170._M_dataplus._M_p,
                                local_170.field_2._M_allocated_capacity + 1);
              }
              if (local_1b8 != &local_1a8) {
                operator_delete(local_1b8,local_1a8 + 1);
              }
              if (local_1f8 != &local_1e8) {
                operator_delete(local_1f8,local_1e8 + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_130._M_dataplus._M_p != &local_130.field_2) {
                operator_delete(local_130._M_dataplus._M_p,
                                local_130.field_2._M_allocated_capacity + 1);
              }
              if (local_1d8 != &local_1c8) {
                operator_delete(local_1d8,local_1c8 + 1);
              }
              if (local_150 != &local_140) {
                operator_delete(local_150,local_140 + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1
                               );
              }
              AnyCellmlElement::AnyCellmlElementImpl::setUnits
                        ((((local_100.
                            super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                           ->mPimpl->mItem).
                          super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->mPimpl,local_f0);
              Issue::IssueImpl::setReferenceRule
                        ((local_100.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->mPimpl,UNIT_ATTRIBUTE_OPTIONAL);
              Logger::LoggerImpl::addIssue(&local_c8->super_LoggerImpl,&local_100);
            }
          }
          if (local_100.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_100.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
        }
      }
LAB_0024e1c3:
      XmlAttribute::next((XmlAttribute *)&local_198);
      this_00._M_pi =
           local_110.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
      local_110.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._M_string_length;
      local_110.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_198._M_dataplus._M_p;
      local_198._M_dataplus._M_p = (pointer)0x0;
      local_198._M_string_length = 0;
      if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._M_string_length);
      }
    } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_110.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0);
    if ((local_a8 & 1) != 0) goto LAB_0024fd25;
  }
  Issue::IssueImpl::create();
  pIVar1 = *(IssueImpl **)(local_218._M_dataplus._M_p + 8);
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_198,"Unit does not specify a units attribute.","");
  Issue::IssueImpl::setDescription(pIVar1,&local_198);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  AnyCellmlElement::AnyCellmlElementImpl::setUnits
            ((AnyCellmlElementImpl *)
             **(undefined8 **)(*(long *)(local_218._M_dataplus._M_p + 8) + 0x28),local_f0);
  Issue::IssueImpl::setReferenceRule(*(IssueImpl **)(local_218._M_dataplus._M_p + 8),UNIT_UNITS);
  Logger::LoggerImpl::addIssue(&local_c8->super_LoggerImpl,(IssuePtr *)&local_218);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._M_string_length);
  }
LAB_0024fd25:
  Units::addUnit((local_f0->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                 ,&local_90,&local_50,local_98,local_a0,&local_70);
  if (local_110.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_110.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_b0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void Parser::ParserImpl::loadUnit(const UnitsPtr &units, const XmlNodePtr &node)
{
    std::string reference;
    std::string prefix = "0";
    double exponent = 1.0;
    double multiplier = 1.0;
    std::string id;
    // A unit should not have any children.
    XmlNodePtr childNode = node->firstChild();
    while (childNode != nullptr) {
        if (childNode->isText()) {
            std::string textNode = childNode->convertToString();
            // Ignore whitespace when parsing.
            if (hasNonWhitespaceCharacters(textNode)) {
                auto issue = Issue::IssueImpl::create();
                issue->mPimpl->setDescription("Unit referencing '" + node->attribute("units") + "' in units '" + units->name() + "' has an invalid non-whitespace child text element '" + textNode + "'.");
                issue->mPimpl->mItem->mPimpl->setUnits(units);
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML_UNEXPECTED_CHARACTER);
                addIssue(issue);
            }
        } else if (childNode->isComment()) {
            // Do nothing.
        } else {
            auto issue = Issue::IssueImpl::create();
            issue->mPimpl->setDescription("Unit referencing '" + node->attribute("units") + "' in units '" + units->name() + "' has an invalid child element '" + childNode->name() + "'.");
            issue->mPimpl->mItem->mPimpl->setUnits(units);
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML_UNEXPECTED_ELEMENT);
            addIssue(issue);
        }
        childNode = childNode->next();
    }
    // Parse the unit attributes.
    XmlAttributePtr attribute = node->firstAttribute();
    bool unitsAttributePresent = false;
    while (attribute != nullptr) {
        if (attribute->isType("units")) {
            if (mParsing1XVersion) {
                reference = convertNonSiUnits(attribute->value());
            } else {
                reference = attribute->value();
            }
            unitsAttributePresent = true;
        } else if (attribute->isType("prefix")) {
            prefix = attribute->value();
        } else if (attribute->isType("exponent")) {
            if (isCellMLReal(attribute->value())) {
                if (!convertToDouble(attribute->value(), exponent)) {
                    // This value won't be saved for validation later, so it does need to be reported now.
                    auto issue = Issue::IssueImpl::create();
                    issue->mPimpl->setDescription("Unit referencing '" + node->attribute("units") + "' in units '" + units->name() + "' has an exponent with the value '" + attribute->value() + "' that is a representation of a CellML real valued number, but out of range of the 'double' type.");
                    issue->mPimpl->mItem->mPimpl->setUnits(units);
                    issue->mPimpl->setReferenceRule(Issue::ReferenceRule::UNIT_ATTRIBUTE_EXPONENT_VALUE);
                    addIssue(issue);
                }
            } else {
                // This value won't be saved for validation later, so it does need to be reported now.
                auto issue = Issue::IssueImpl::create();
                issue->mPimpl->setDescription("Unit referencing '" + node->attribute("units") + "' in units '" + units->name() + "' has an exponent with the value '" + attribute->value() + "' that is not a representation of a CellML real valued number.");
                issue->mPimpl->mItem->mPimpl->setUnits(units);
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::UNIT_ATTRIBUTE_EXPONENT_VALUE);
                addIssue(issue);
            }
        } else if (attribute->isType("multiplier")) {
            if (isCellMLReal(attribute->value())) {
                if (!convertToDouble(attribute->value(), multiplier)) {
                    // This value won't be saved for validation later, so it does need to be reported now.
                    auto issue = Issue::IssueImpl::create();
                    issue->mPimpl->setDescription("Unit referencing '" + node->attribute("units") + "' in units '" + units->name() + "' has a multiplier with the value '" + attribute->value() + "' that is a representation of a CellML real valued number, but out of range of the 'double' type.");
                    issue->mPimpl->mItem->mPimpl->setUnits(units);
                    issue->mPimpl->setReferenceRule(Issue::ReferenceRule::UNIT_ATTRIBUTE_MULTIPLIER_VALUE);
                    addIssue(issue);
                }
            } else {
                // This value won't be saved for validation later, so it does need to be reported now.
                auto issue = Issue::IssueImpl::create();
                issue->mPimpl->setDescription("Unit referencing '" + node->attribute("units") + "' in units '" + units->name() + "' has a multiplier with the value '" + attribute->value() + "' that is not a representation of a CellML real valued number.");
                issue->mPimpl->mItem->mPimpl->setUnits(units);
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::UNIT_ATTRIBUTE_MULTIPLIER_VALUE);
                addIssue(issue);
            }
        } else if (isIdAttribute(attribute, mParsing1XVersion)) {
            id = attribute->value();
        } else {
            auto issue = Issue::IssueImpl::create();
            issue->mPimpl->setDescription("Unit referencing '" + node->attribute("units") + "' in units '" + units->name() + "' has an invalid attribute '" + attribute->name() + "'.");
            issue->mPimpl->mItem->mPimpl->setUnits(units);
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::UNIT_ATTRIBUTE_OPTIONAL);
            addIssue(issue);
        }
        attribute = attribute->next();
    }

    if (!unitsAttributePresent) {
        auto issue = Issue::IssueImpl::create();
        issue->mPimpl->setDescription("Unit does not specify a units attribute.");
        issue->mPimpl->mItem->mPimpl->setUnits(units);
        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::UNIT_UNITS);
        addIssue(issue);
    }

    // Add this unit to the parent units.
    units->addUnit(reference, prefix, exponent, multiplier, id);
}